

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Startall(int count,MPIABI_Request *array_of_requests)

{
  int iVar1;
  int ierr;
  MPI_Request *reqs;
  MPIABI_Request *array_of_requests_local;
  int count_local;
  
  iVar1 = MPI_Startall(count,array_of_requests);
  return iVar1;
}

Assistant:

int MPIABI_Startall(int count, MPIABI_Request array_of_requests[]) {
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  const int ierr = MPI_Startall(count, reqs);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  return ierr;
}